

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O2

int substrcmp(char *text,char *pat,size_t len)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  
  cVar1 = *pat;
  if (cVar1 == '\0') {
    uVar3 = (uint)(*text == '\0');
  }
  else {
    uVar3 = 1;
    for (; *text != '\0'; text = text + 1) {
      if ((*text == cVar1) && (iVar2 = strncmp(text,pat,len), iVar2 == 0)) {
        return 0;
      }
    }
  }
  return uVar3;
}

Assistant:

static int substrcmp(const char *text, const char *pat, size_t len)
{
    char c;

    if ((c = *pat) == '\0')
        return *text == '\0';

    for ( ; *text; text++) {
        if (*text == c && strncmp(text, pat, len) == 0)
            return 0;
    }

    return 1;
}